

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall
Minisat::Option::printOptionsDependencies(Option *this,FILE *pcsFile,int granularity)

{
  ulong uVar1;
  char *pcVar2;
  undefined4 in_EDX;
  FILE *in_RSI;
  long *in_RDI;
  char defaultAsString [2048];
  undefined1 local_818 [2052];
  undefined4 local_14;
  FILE *local_10;
  
  if (((((in_RDI[5] != 0) &&
        (local_14 = in_EDX, local_10 = in_RSI,
        uVar1 = (**(code **)(*(long *)in_RDI[5] + 0x48))((long *)in_RDI[5],in_EDX), (uVar1 & 1) != 0
        )) && (pcVar2 = strstr((char *)in_RDI[1],"debug"), pcVar2 == (char *)0x0)) &&
      ((pcVar2 = strstr((char *)in_RDI[2],"debug"), pcVar2 == (char *)0x0 &&
       (pcVar2 = strstr(*(char **)(in_RDI[5] + 8),"debug"), pcVar2 == (char *)0x0)))) &&
     ((pcVar2 = strstr(*(char **)(in_RDI[5] + 0x10),"debug"), pcVar2 == (char *)0x0 &&
      ((uVar1 = (**(code **)(*in_RDI + 0x50))(), (uVar1 & 1) != 0 &&
       (uVar1 = (**(code **)(*(long *)in_RDI[5] + 0x50))(), (uVar1 & 1) != 0)))))) {
    (**(code **)(*(long *)in_RDI[5] + 0x58))((long *)in_RDI[5],local_14,local_818,0x7ff);
    fprintf(local_10,"%s   | %s in {%s} #  only active, if %s has not its default value \n",
            in_RDI[1],*(undefined8 *)(in_RDI[5] + 8),local_818,*(undefined8 *)(in_RDI[5] + 8));
  }
  return;
}

Assistant:

void printOptionsDependencies(FILE *pcsFile, int granularity)
    {

        if (dependOnNonDefaultOf == 0) {
            return;
        } // no dependency
        if (!dependOnNonDefaultOf->canPrintOppositeOfDefault(granularity)) {
            return;
        } // cannot express opposite value of dependency-parent
        if (strstr(name, "debug") != 0 || strstr(description, "debug") != 0) {
            return;
        } // do not print the parameter, if its is related to debug output
        if (strstr(dependOnNonDefaultOf->name, "debug") != 0 || strstr(dependOnNonDefaultOf->description, "debug") != 0) {
            return;
        } // do not print the parameter, if its parent is related to debug output
        if (!wouldPrintOption()) {
            return;
        } // do not print this option
        if (!dependOnNonDefaultOf->wouldPrintOption()) {
            return;
        } // do not print parent option

        char defaultAsString[2048]; // take care of HUGEVAL in double, or string values
        dependOnNonDefaultOf->getNonDefaultString(granularity, defaultAsString, 2047);
        assert(strlen(defaultAsString) < 2047 && "memory overflow");
        fprintf(pcsFile, "%s   | %s in {%s} #  only active, if %s has not its default value \n", name,
                dependOnNonDefaultOf->name, defaultAsString, dependOnNonDefaultOf->name);
    }